

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

void __thiscall
cmGraphVizWriter::cmGraphVizWriter
          (cmGraphVizWriter *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *localGenerators)

{
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *local_18;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *localGenerators_local;
  cmGraphVizWriter *this_local;
  
  local_18 = localGenerators;
  localGenerators_local = (vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"digraph",&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->GraphName,"GG",local_2d);
  std::allocator<char>::~allocator((allocator<char> *)local_2d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&this->GraphHeader,"node [\n  fontsize = \"12\"\n];",&local_2e);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->GraphNodePrefix,"node",&local_2f);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::vector
            (&this->TargetsToIgnoreRegex);
  this->LocalGenerators = local_18;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
  ::map(&this->TargetPtrs);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->TargetNamesNodes);
  this->GenerateForExecutables = true;
  this->GenerateForStaticLibs = true;
  this->GenerateForSharedLibs = true;
  this->GenerateForModuleLibs = true;
  this->GenerateForExternals = true;
  this->GeneratePerTarget = true;
  this->GenerateDependers = true;
  this->HaveTargetsAndLibs = false;
  return;
}

Assistant:

cmGraphVizWriter::cmGraphVizWriter(
  const std::vector<cmLocalGenerator*>& localGenerators)
  : GraphType("digraph")
  , GraphName("GG")
  , GraphHeader("node [\n  fontsize = \"12\"\n];")
  , GraphNodePrefix("node")
  , LocalGenerators(localGenerators)
  , GenerateForExecutables(true)
  , GenerateForStaticLibs(true)
  , GenerateForSharedLibs(true)
  , GenerateForModuleLibs(true)
  , GenerateForExternals(true)
  , GeneratePerTarget(true)
  , GenerateDependers(true)
  , HaveTargetsAndLibs(false)
{
}